

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::printFloat(ostringstream *oss,double d)

{
  _func_int *p_Var1;
  _Ios_Fmtflags __fmtfl;
  double d_local;
  ostringstream *oss_local;
  
  p_Var1 = (oss->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream[-3];
  __fmtfl = std::operator|(_S_fixed,_S_internal);
  std::ios_base::setf((ios_base *)
                      ((long)&(oss->super_basic_ostream<char,_std::char_traits<char>_>).
                              _vptr_basic_ostream + (long)p_Var1),__fmtfl);
  std::ios_base::precision
            ((ios_base *)
             ((long)&(oss->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream +
             (long)(oss->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream[-3]
             ),4);
  std::ios_base::width
            ((ios_base *)
             ((long)&(oss->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream +
             (long)(oss->super_basic_ostream<char,_std::char_traits<char>_>)._vptr_basic_ostream[-3]
             ),7);
  std::ostream::operator<<(oss,d);
  return;
}

Assistant:

void printFloat (ostringstream& oss, double d)
{
	oss.setf(oss.fixed | oss.internal);
	oss.precision(4);
	oss.width(7);
	oss << d;
}